

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptAnnotations(HlslGrammar *this,TQualifier *param_1)

{
  int *piVar1;
  bool bVar2;
  TIntermNode *node;
  TIntermNode *local_20;
  
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (bVar2) {
    piVar1 = &this->parseContext->annotationNestingLevel;
    *piVar1 = *piVar1 + 1;
    do {
      do {
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
      } while (bVar2);
      bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
      if (bVar2) {
        piVar1 = &this->parseContext->annotationNestingLevel;
        *piVar1 = *piVar1 + -1;
        return true;
      }
      local_20 = (TIntermNode *)0x0;
      bVar2 = acceptDeclaration(this,&local_20);
    } while (bVar2);
    (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this->parseContext,&(this->super_HlslTokenStream).token,"Expected",
               "declaration in annotation","");
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptAnnotations(TQualifier&)
{
    if (! acceptTokenClass(EHTokLeftAngle))
        return false;

    // note that we are nesting a name space
    parseContext.nestAnnotations();

    // declaration SEMI_COLON ... declaration SEMICOLON RIGHT_ANGLE
    do {
        // eat any extra SEMI_COLON; don't know if the grammar calls for this or not
        while (acceptTokenClass(EHTokSemicolon))
            ;

        if (acceptTokenClass(EHTokRightAngle))
            break;

        // declaration
        TIntermNode* node = nullptr;
        if (! acceptDeclaration(node)) {
            expected("declaration in annotation");
            return false;
        }
    } while (true);

    parseContext.unnestAnnotations();
    return true;
}